

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O2

duckdb_logical_type
duckdb_create_union_type(duckdb_logical_type *member_types_p,char **member_names,idx_t member_count)

{
  LogicalType *this;
  idx_t iVar1;
  child_list_t<duckdb::LogicalType> members;
  child_list_t<LogicalType> local_a0;
  pair<const_char_*,_duckdb::LogicalType> local_88;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  local_68;
  
  if (member_names == (char **)0x0 || member_types_p == (duckdb_logical_type *)0x0) {
    this = (LogicalType *)0x0;
  }
  else {
    this = (LogicalType *)operator_new(0x18);
    duckdb::LogicalType::LogicalType(this);
    members.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    members.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    members.
    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    .
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (iVar1 = 0; member_count != iVar1; iVar1 = iVar1 + 1) {
      std::pair<const_char_*,_duckdb::LogicalType>::pair<const_char_*&,_duckdb::LogicalType_&,_true>
                (&local_88,member_names,(LogicalType *)member_types_p[iVar1]);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
      ::pair<const_char_*,_duckdb::LogicalType,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                  *)&local_68,&local_88);
      std::
      vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
      ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                  *)&members,&local_68);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
               *)&local_68);
      duckdb::LogicalType::~LogicalType(&local_88.second);
      member_names = member_names + 1;
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_a0,
             &members.
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            );
    duckdb::LogicalType::UNION((LogicalType *)&local_68,&local_a0);
    duckdb::LogicalType::operator=(this,(LogicalType *)&local_68);
    duckdb::LogicalType::~LogicalType((LogicalType *)&local_68);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_a0);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&members);
  }
  return (duckdb_logical_type)this;
}

Assistant:

duckdb_logical_type duckdb_create_union_type(duckdb_logical_type *member_types_p, const char **member_names,
                                             idx_t member_count) {
	if (!member_types_p || !member_names) {
		return nullptr;
	}
	duckdb::LogicalType **member_types = reinterpret_cast<duckdb::LogicalType **>(member_types_p);
	duckdb::LogicalType *mtype = new duckdb::LogicalType;
	duckdb::child_list_t<duckdb::LogicalType> members;

	for (idx_t i = 0; i < member_count; i++) {
		members.push_back(make_pair(member_names[i], *member_types[i]));
	}
	*mtype = duckdb::LogicalType::UNION(members);
	return reinterpret_cast<duckdb_logical_type>(mtype);
}